

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::insertSpirvExecutionMode
          (TIntermediate *this,int executionMode,TIntermAggregate *args)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  int iVar3;
  TPoolAllocator *pTVar4;
  TSpirvExecutionMode *pTVar5;
  undefined4 extraout_var;
  vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  *this_00;
  undefined8 *puVar6;
  TIntermConstantUnion *extraOperand;
  int local_54;
  TIntermConstantUnion *local_50;
  vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  local_48;
  
  local_54 = executionMode;
  if (this->spirvExecutionMode == (TSpirvExecutionMode *)0x0) {
    pTVar4 = GetThreadPoolAllocator();
    pTVar5 = (TSpirvExecutionMode *)TPoolAllocator::allocate(pTVar4,0x70);
    pTVar4 = GetThreadPoolAllocator();
    (pTVar5->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Node_allocator.allocator = pTVar4;
    p_Var1 = &(pTVar5->modes).
              super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    (pTVar5->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pTVar5->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pTVar5->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pTVar5->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pTVar5->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pTVar4 = GetThreadPoolAllocator();
    (pTVar5->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Node_allocator.allocator = pTVar4;
    p_Var1 = &(pTVar5->modeIds).
              super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    (pTVar5->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pTVar5->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pTVar5->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pTVar5->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pTVar5->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->spirvExecutionMode = pTVar5;
  }
  local_48.
  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_48.
  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (TIntermConstantUnion **)0x0;
  local_48.
  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (TIntermConstantUnion **)0x0;
  if (args != (TIntermAggregate *)0x0) {
    iVar3 = (*(args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])(args);
    puVar6 = *(undefined8 **)(CONCAT44(extraout_var,iVar3) + 8);
    puVar2 = *(undefined8 **)(CONCAT44(extraout_var,iVar3) + 0x10);
    if (puVar6 != puVar2) {
      do {
        local_50 = (TIntermConstantUnion *)(**(code **)(*(long *)*puVar6 + 0x28))();
        if (local_50 == (TIntermConstantUnion *)0x0) {
          __assert_fail("extraOperand != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                        ,0x7f,
                        "void glslang::TIntermediate::insertSpirvExecutionMode(int, const TIntermAggregate *)"
                       );
        }
        if (local_48.
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_48.
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glslang::TIntermConstantUnion_const*,glslang::pool_allocator<glslang::TIntermConstantUnion_const*>>
          ::_M_realloc_insert<glslang::TIntermConstantUnion_const*const&>
                    ((vector<glslang::TIntermConstantUnion_const*,glslang::pool_allocator<glslang::TIntermConstantUnion_const*>>
                      *)&local_48,
                     (iterator)
                     local_48.
                     super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          *local_48.
           super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = local_50;
          local_48.
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar2);
    }
  }
  this_00 = &std::
             map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
             ::operator[]((map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                           *)this->spirvExecutionMode,&local_54)->
             super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ;
  std::
  vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
  ::operator=(this_00,&local_48);
  return;
}

Assistant:

void TIntermediate::insertSpirvExecutionMode(int executionMode, const TIntermAggregate* args)
{
    if (!spirvExecutionMode)
        spirvExecutionMode = new TSpirvExecutionMode;

    TVector<const TIntermConstantUnion*> extraOperands;
    if (args) {
        for (auto arg : args->getSequence()) {
            auto extraOperand = arg->getAsConstantUnion();
            assert(extraOperand != nullptr);
            extraOperands.push_back(extraOperand);
        }
    }
    spirvExecutionMode->modes[executionMode] = extraOperands;
}